

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

int BaseSocket::EnumIpAddresses
              (function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
               *fnCallBack,void *vpUser)

{
  int iVar1;
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  local_38;
  void *local_18;
  void *vpUser_local;
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  *fnCallBack_local;
  
  local_18 = vpUser;
  vpUser_local = fnCallBack;
  std::
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  ::function(&local_38,fnCallBack);
  iVar1 = BaseSocketImpl::EnumIpAddresses(&local_38,local_18);
  std::
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  ::~function(&local_38);
  return iVar1;
}

Assistant:

int BaseSocket::EnumIpAddresses(std::function<int(int, const std::string&, int, void*)> fnCallBack, void* vpUser)
{
    return BaseSocketImpl::EnumIpAddresses(fnCallBack, vpUser);
}